

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  ulong uVar1;
  byte type;
  uint8_t type_00;
  _Bool _Var2;
  ulong uVar3;
  art_val_t *paVar4;
  container_t *pcVar5;
  leaf_t val;
  long lVar6;
  uint range_end;
  uint32_t range_start;
  uint8_t typecode2;
  uint8_t current_high48_key [6];
  byte local_59;
  uint local_58;
  ushort local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (min <= max) {
    local_40 = min >> 0x10;
    local_38 = max >> 0x10;
    local_4c = (uint)min & 0xffff;
    local_50 = ((uint)max & 0xffff) + 1;
    local_48 = local_40 - local_38;
    for (lVar6 = 0; uVar3 = local_40 + lVar6, uVar3 <= local_38; lVar6 = lVar6 + 1) {
      local_58 = ((uint)(uVar3 >> 0x20) & 0xff00) >> 8 | (uint)(uVar3 >> 0x18) & 0xff00 |
                 (uint)(uVar3 >> 8) & 0xff0000 | (uint)(((uVar3 & 0xff0000) << 0x18) >> 0x10);
      local_54 = (ushort)(uVar3 >> 8) & 0xff | (ushort)((uVar3 << 0x38) >> 0x30);
      range_start = 0;
      if (lVar6 == 0) {
        range_start = local_4c;
      }
      range_end = 0x10000;
      if (local_48 + lVar6 == 0) {
        range_end = local_50;
      }
      paVar4 = art_find(&r->art,(art_key_chunk_t *)&local_58);
      if (paVar4 == (art_val_t *)0x0) {
        pcVar5 = container_range_of_ones(range_start,range_end,&local_59);
        val = add_container(r,pcVar5,local_59);
        art_insert(&r->art,(art_key_chunk_t *)&local_58,val);
      }
      else {
        type_00 = (uint8_t)*paVar4;
        if ((range_start == 0) && (0xffff < range_end)) {
          pcVar5 = container_inot(r->containers[*paVar4 >> 8],type_00,&local_59);
        }
        else {
          pcVar5 = container_inot_range
                             (r->containers[*paVar4 >> 8],type_00,range_start,range_end,&local_59);
        }
        type = local_59;
        uVar3 = (ulong)local_59;
        _Var2 = container_nonzero_cardinality(pcVar5,local_59);
        if (_Var2) {
          uVar1 = *paVar4;
          r->containers[uVar1 >> 8] = pcVar5;
          *paVar4 = uVar1 & 0xffffffffffffff00 | uVar3;
        }
        else {
          art_erase(&r->art,(art_key_chunk_t *)&local_58,(art_val_t *)0x0);
          container_free(pcVar5,type);
          uVar3 = *paVar4 >> 8;
          r->containers[uVar3] = (container_t *)0x0;
          if (uVar3 < r->first_free) {
            r->first_free = uVar3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_flip_closed_inplace(roaring64_bitmap_t *r, uint64_t min,
                                          uint64_t max) {
    if (min > max) {
        return;
    }
    uint16_t min_low16 = (uint16_t)min;
    uint16_t max_low16 = (uint16_t)max;
    uint64_t min_high48_bits = (min & 0xFFFFFFFFFFFF0000ULL) >> 16;
    uint64_t max_high48_bits = (max & 0xFFFFFFFFFFFF0000ULL) >> 16;

    // Flip the range (including non-existent containers!) between min and
    // max.
    for (uint64_t high48_bits = min_high48_bits; high48_bits <= max_high48_bits;
         high48_bits++) {
        uint8_t current_high48_key[ART_KEY_BYTES];
        split_key(high48_bits << 16, current_high48_key);

        uint32_t min_container = 0;
        if (high48_bits == min_high48_bits) {
            min_container = min_low16;
        }
        uint32_t max_container = 0xFFFF + 1;  // Exclusive range.
        if (high48_bits == max_high48_bits) {
            max_container = max_low16 + 1;  // Exclusive.
        }

        roaring64_flip_leaf_inplace(r, current_high48_key, min_container,
                                    max_container);
    }
}